

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableExtensionLiteGenerator local_70;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x78)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                (&local_70,(FieldDescriptor *)(*(long *)(pDVar1 + 0x80) + lVar2),this->context_);
      ImmutableExtensionLiteGenerator::GenerateRegistrationCode(&local_70,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&local_70);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pDVar1 + 0x78));
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x48)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableMessageLiteGenerator
                ((ImmutableMessageLiteGenerator *)&local_70,
                 (Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar2),this->context_);
      GenerateExtensionRegistrationCode((ImmutableMessageLiteGenerator *)&local_70,printer);
      local_70.super_ExtensionGenerator._vptr_ExtensionGenerator =
           (_func_int **)&PTR__ImmutableMessageLiteGenerator_004276f0;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
      ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                          *)&local_70.scope_);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&local_70);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pDVar1 + 0x48));
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::
GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
      .GenerateExtensionRegistrationCode(printer);
  }
}